

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

void __thiscall
Fossilize::ExternalReplayer::Impl::start_replayer_process(Impl *this,Options *options,int ctl_fd)

{
  char *__path;
  int iVar1;
  reference pvVar2;
  pointer __s;
  int *piVar3;
  reference ppcVar4;
  char **__argv;
  uint local_2ac;
  sched_param local_2a8;
  uint i_3;
  sched_param p;
  int null_fd;
  pointer local_298;
  char *local_290;
  uint local_284;
  undefined1 local_280 [4];
  uint i_2;
  vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> implicit_indices;
  char *local_260;
  undefined1 local_258 [8];
  char timeout [16];
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char local_1f8 [8];
  char raytracing_range_end [16];
  char raytracing_range_start [16];
  char compute_range_end [16];
  char compute_range_start [16];
  char graphics_range_end [16];
  char graphics_range_start [16];
  char *local_190;
  char local_188 [8];
  char index_name [16];
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char local_119 [8];
  char whitelist_hex [9];
  char *local_108;
  char *local_100;
  char *local_f8;
  value_type local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  uint local_a4;
  value_type pcStack_a0;
  uint i_1;
  uint local_94;
  undefined1 local_90 [4];
  uint i;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string self_path;
  char num_thread_holder [16];
  char control_fd_name [16];
  char fd_name [16];
  int ctl_fd_local;
  Options *options_local;
  Impl *this_local;
  
  sprintf(control_fd_name + 8,"%d",(ulong)(uint)this->fd);
  std::__cxx11::string::string
            ((string *)
             &argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90);
  if (options->num_external_replayer_arguments == 0) {
    if (options->external_replayer_path == (char *)0x0) {
      std::__cxx11::string::operator=
                ((string *)
                 &argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"/proc/self/exe");
      pcStack_a0 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
                 &stack0xffffffffffffff60);
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
                 &options->external_replayer_path);
    }
  }
  else {
    for (local_94 = 0; local_94 < options->num_external_replayer_arguments; local_94 = local_94 + 1)
    {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
                 options->external_replayer_arguments + local_94);
    }
  }
  for (local_a4 = 0; local_a4 < options->num_databases; local_a4 = local_a4 + 1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               options->databases + local_a4);
  }
  local_b0 = "--master-process";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_b0);
  if ((options->quiet & 1U) != 0) {
    local_b8 = "--quiet-slave";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_b8);
  }
  local_c0 = "--shmem-fd";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_c0);
  local_c8 = control_fd_name + 8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_c8);
  if (-1 < ctl_fd) {
    local_d0 = "--control-fd";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_d0);
    sprintf(num_thread_holder + 8,"%d",(ulong)(uint)ctl_fd);
    local_d8 = num_thread_holder + 8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_d8);
  }
  if ((options->spirv_validate & 1U) != 0) {
    local_e0 = "--spirv-val";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_e0);
  }
  if (options->num_threads != 0) {
    local_e8 = "--num-threads";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_e8);
    sprintf(self_path.field_2._M_local_buf + 8,"%u",(ulong)options->num_threads);
    local_f0 = (value_type)((long)&self_path.field_2 + 8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_f0);
  }
  if (options->on_disk_pipeline_cache != (char *)0x0) {
    local_f8 = "--on-disk-pipeline-cache";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_f8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->on_disk_pipeline_cache);
  }
  if (options->on_disk_validation_cache != (char *)0x0) {
    local_100 = "--on-disk-validation-cache";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_100);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->on_disk_validation_cache);
  }
  if (options->on_disk_validation_whitelist != (char *)0x0) {
    local_108 = "--on-disk-validation-whitelist";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_108);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->on_disk_validation_whitelist);
  }
  if (options->on_disk_validation_blacklist != (char *)0x0) {
    whitelist_hex._1_8_ = anon_var_dwarf_5e0f8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               (value_type *)(whitelist_hex + 1));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->on_disk_validation_blacklist);
  }
  if (options->on_disk_replay_whitelist != (char *)0x0) {
    local_128 = "--on-disk-replay-whitelist";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_128);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->on_disk_replay_whitelist);
    sprintf(local_119,"%x",(ulong)options->on_disk_replay_whitelist_mask);
    local_130 = "--on-disk-replay-whitelist-mask";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_130);
    local_138 = local_119;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_138);
  }
  if (options->on_disk_module_identifier != (char *)0x0) {
    local_140 = "--on-disk-module-identifier";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_140);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->on_disk_module_identifier);
  }
  if (options->replayer_cache_path != (char *)0x0) {
    local_148 = "--replayer-cache";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_148);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->replayer_cache_path);
  }
  if ((options->enable_validation & 1U) != 0) {
    local_150 = "--enable-validation";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_150);
  }
  if ((options->disable_signal_handler & 1U) != 0) {
    local_158 = "--disable-signal-handler";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_158);
  }
  if ((options->disable_rate_limiter & 1U) != 0) {
    local_160 = "--disable-rate-limiter";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_160);
  }
  if ((options->null_device & 1U) != 0) {
    local_168 = "--null-device";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_168);
  }
  local_170 = "--device-index";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_170);
  sprintf(local_188,"%u",(ulong)options->device_index);
  local_190 = local_188;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_190);
  if ((options->use_pipeline_range & 1U) != 0) {
    local_200 = "--graphics-pipeline-range";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_200);
    sprintf(graphics_range_end + 8,"%u",(ulong)options->start_graphics_index);
    sprintf(compute_range_start + 8,"%u",(ulong)options->end_graphics_index);
    local_208 = graphics_range_end + 8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_208);
    local_210 = compute_range_start + 8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_210);
    local_218 = "--compute-pipeline-range";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_218);
    sprintf(compute_range_end + 8,"%u",(ulong)options->start_compute_index);
    sprintf(raytracing_range_start + 8,"%u",(ulong)options->end_compute_index);
    local_220 = compute_range_end + 8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_220);
    local_228 = raytracing_range_start + 8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_228);
    local_230 = "--raytracing-pipeline-range";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_230);
    sprintf(raytracing_range_end + 8,"%u",(ulong)options->start_raytracing_index);
    sprintf(local_1f8,"%u",(ulong)options->end_raytracing_index);
    local_238 = raytracing_range_end + 8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_238);
    local_240 = local_1f8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_240);
  }
  if (options->pipeline_stats_path != (char *)0x0) {
    timeout._8_8_ = anon_var_dwarf_5e1a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               (value_type *)(timeout + 8));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               &options->pipeline_stats_path);
  }
  if (options->timeout_seconds != 0) {
    local_260 = "--timeout-seconds";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_260);
    sprintf(local_258,"%u",(ulong)options->timeout_seconds);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_258;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,
               (value_type *)
               &implicit_indices.
                super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>::vector
            ((vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> *)local_280);
  std::vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>::resize
            ((vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> *)local_280,
             (ulong)options->num_implicit_whitelist_indices);
  for (local_284 = 0; local_284 < options->num_implicit_whitelist_indices; local_284 = local_284 + 1
      ) {
    local_290 = "--implicit-whitelist";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_290);
    pvVar2 = std::vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>::
             operator[]((vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> *)
                        local_280,(ulong)local_284);
    __s = std::array<char,_16UL>::data(pvVar2);
    sprintf(__s,"%u",(ulong)options->implicit_whitelist_indices[local_284]);
    pvVar2 = std::vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>::
             operator[]((vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> *)
                        local_280,(ulong)local_284);
    local_298 = std::array<char,_16UL>::data(pvVar2);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,&local_298);
  }
  _p = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,(value_type *)&p);
  if (((options->quiet & 1U) != 0) && (i_3 = open("/dev/null",1), -1 < (int)i_3)) {
    dup2(i_3,1);
    dup2(i_3,2);
    close(i_3);
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  if ((((options->disable_rate_limiter & 1U) == 0) && (iVar1 = nice(0x13), iVar1 == -1)) &&
     (piVar3 = __errno_location(), *piVar3 != 0)) {
    fprintf(_stderr,"Fossilize ERROR: Failed to set nice value for external replayer!\n");
  }
  memset(&local_2a8,0,4);
  iVar1 = sched_setscheduler(0,3,&local_2a8);
  if (iVar1 < 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to set scheduling policy for external replayer!\n");
  }
  if (((options->disable_rate_limiter & 1U) == 0) && (iVar1 = ioprio_set(1,0,0x6000), iVar1 < 0)) {
    fprintf(_stderr,"Fossilize ERROR: Failed to set IO priority for external replayer!\n");
  }
  for (local_2ac = 0; local_2ac < options->num_environment_variables; local_2ac = local_2ac + 1) {
    setenv(options->environment_variables[local_2ac].key,
           options->environment_variables[local_2ac].value,1);
  }
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90,0);
  __path = *ppcVar4;
  __argv = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_90);
  iVar1 = execv(__path,__argv);
  if (-1 < iVar1) {
    fprintf(_stderr,"Fossilize ERROR: Failed to start external process %s with execv.\n",
            options->external_replayer_path);
    exit(1);
  }
  fprintf(_stderr,"Fossilize ERROR: Failed to start external process %s with execv.\n",
          options->external_replayer_path);
  piVar3 = __errno_location();
  exit(*piVar3);
}

Assistant:

void ExternalReplayer::Impl::start_replayer_process(const ExternalReplayer::Options &options, int ctl_fd)
{
	char fd_name[16], control_fd_name[16];
	sprintf(fd_name, "%d", fd);
	char num_thread_holder[16];

	std::string self_path;
	std::vector<const char *> argv;
	if (options.num_external_replayer_arguments)
	{
		for (unsigned i = 0; i < options.num_external_replayer_arguments; i++)
			argv.push_back(options.external_replayer_arguments[i]);
	}
	else if (options.external_replayer_path)
		argv.push_back(options.external_replayer_path);
	else
	{
#ifdef __linux__
		self_path = "/proc/self/exe";
#else
		self_path = Path::get_executable_path();
#endif
		argv.push_back(self_path.c_str());
	}

	for (unsigned i = 0; i < options.num_databases; i++)
		argv.push_back(options.databases[i]);

	argv.push_back("--master-process");
	if (options.quiet)
		argv.push_back("--quiet-slave");
	argv.push_back("--shmem-fd");
	argv.push_back(fd_name);

	if (ctl_fd >= 0)
	{
		argv.push_back("--control-fd");
		sprintf(control_fd_name, "%d", ctl_fd);
		argv.push_back(control_fd_name);
	}

	if (options.spirv_validate)
		argv.push_back("--spirv-val");

	if (options.num_threads)
	{
		argv.push_back("--num-threads");
		sprintf(num_thread_holder, "%u", options.num_threads);
		argv.push_back(num_thread_holder);
	}

	if (options.on_disk_pipeline_cache)
	{
		argv.push_back("--on-disk-pipeline-cache");
		argv.push_back(options.on_disk_pipeline_cache);
	}

	if (options.on_disk_validation_cache)
	{
		argv.push_back("--on-disk-validation-cache");
		argv.push_back(options.on_disk_validation_cache);
	}

	if (options.on_disk_validation_whitelist)
	{
		argv.push_back("--on-disk-validation-whitelist");
		argv.push_back(options.on_disk_validation_whitelist);
	}

	if (options.on_disk_validation_blacklist)
	{
		argv.push_back("--on-disk-validation-blacklist");
		argv.push_back(options.on_disk_validation_blacklist);
	}

	char whitelist_hex[9];
	if (options.on_disk_replay_whitelist)
	{
		argv.push_back("--on-disk-replay-whitelist");
		argv.push_back(options.on_disk_replay_whitelist);

		sprintf(whitelist_hex, "%x", options.on_disk_replay_whitelist_mask);
		argv.push_back("--on-disk-replay-whitelist-mask");
		argv.push_back(whitelist_hex);
	}

	if (options.on_disk_module_identifier)
	{
		argv.push_back("--on-disk-module-identifier");
		argv.push_back(options.on_disk_module_identifier);
	}

	if (options.replayer_cache_path)
	{
		argv.push_back("--replayer-cache");
		argv.push_back(options.replayer_cache_path);
	}

	if (options.enable_validation)
		argv.push_back("--enable-validation");

	if (options.disable_signal_handler)
		argv.push_back("--disable-signal-handler");
	if (options.disable_rate_limiter)
		argv.push_back("--disable-rate-limiter");

	if (options.null_device)
		argv.push_back("--null-device");

	argv.push_back("--device-index");
	char index_name[16];
	sprintf(index_name, "%u", options.device_index);
	argv.push_back(index_name);

	char graphics_range_start[16], graphics_range_end[16];
	char compute_range_start[16], compute_range_end[16];
	char raytracing_range_start[16], raytracing_range_end[16];

	if (options.use_pipeline_range)
	{
		argv.push_back("--graphics-pipeline-range");
		sprintf(graphics_range_start, "%u", options.start_graphics_index);
		sprintf(graphics_range_end, "%u", options.end_graphics_index);
		argv.push_back(graphics_range_start);
		argv.push_back(graphics_range_end);

		argv.push_back("--compute-pipeline-range");
		sprintf(compute_range_start, "%u", options.start_compute_index);
		sprintf(compute_range_end, "%u", options.end_compute_index);
		argv.push_back(compute_range_start);
		argv.push_back(compute_range_end);

		argv.push_back("--raytracing-pipeline-range");
		sprintf(raytracing_range_start, "%u", options.start_raytracing_index);
		sprintf(raytracing_range_end, "%u", options.end_raytracing_index);
		argv.push_back(raytracing_range_start);
		argv.push_back(raytracing_range_end);
	}

	if (options.pipeline_stats_path)
	{
		argv.push_back("--enable-pipeline-stats");
		argv.push_back(options.pipeline_stats_path);
	}

	char timeout[16];
	if (options.timeout_seconds)
	{
		argv.push_back("--timeout-seconds");
		sprintf(timeout, "%u", options.timeout_seconds);
		argv.push_back(timeout);
	}

	std::vector<std::array<char, 16>> implicit_indices;
	implicit_indices.resize(options.num_implicit_whitelist_indices);
	for (unsigned i = 0; i < options.num_implicit_whitelist_indices; i++)
	{
		argv.push_back("--implicit-whitelist");
		sprintf(implicit_indices[i].data(), "%u", options.implicit_whitelist_indices[i]);
		argv.push_back(implicit_indices[i].data());
	}

	argv.push_back(nullptr);

	if (options.quiet)
	{
		int null_fd = open("/dev/null", O_WRONLY);
		if (null_fd >= 0)
		{
			dup2(null_fd, STDOUT_FILENO);
			dup2(null_fd, STDERR_FILENO);
			close(null_fd);
		}
	}

	// Replayer should have idle priority.
	// nice() can return -1 in valid scenarios, need to check errno.
	errno = 0;

	if (!options.disable_rate_limiter)
	{
		if (nice(19) == -1 && errno != 0)
			LOGE("Failed to set nice value for external replayer!\n");
	}

#ifdef __linux__
	// Replayer crunches a lot of numbers, hint the scheduler.
	// This results in better throughput at the same or lower CPU usage (due
	// to better CPU cache utilization with bigger time slices), it doesn't
	// preempt interactive tasks (less impact on games), and it also makes a
	// better chance for the block layer to coalesce IO requests (more IO
	// may be dispatched per time slice).
	{
		struct sched_param p = {};
		if (sched_setscheduler(0, SCHED_BATCH, &p) < 0)
			LOGE("Failed to set scheduling policy for external replayer!\n");
	}

	if (!options.disable_rate_limiter)
	{
		// Hint the IO scheduler that we don't want a fair share of the disk
		// bandwidth.
		// https://www.kernel.org/doc/html/latest/block/ioprio.html
		if (ioprio_set(IOPRIO_WHO_PROCESS, 0, IOPRIO_PRIO_VALUE(IOPRIO_CLASS_IDLE, 0)) < 0)
			LOGE("Failed to set IO priority for external replayer!\n");
	}
#endif

#ifdef __APPLE__
	if (!options.disable_rate_limiter)
	{
		// Hint the IO scheduler that we don't want to impact foreground
		// latency.
		// https://www.unix.com/man-page/osx/3/setiopolicy_np/
		if (setiopolicy_np(IOPOL_TYPE_DISK, IOPOL_SCOPE_PROCESS, IOPOL_UTILITY) < 0)
			LOGE("Failed to set IO policy for external replayer!\n");
	}
#endif

	// We're now in the child process, so it's safe to override environment here.
	for (unsigned i = 0; i < options.num_environment_variables; i++)
		setenv(options.environment_variables[i].key, options.environment_variables[i].value, 1);

	if (execv(argv[0], const_cast<char * const*>(argv.data())) < 0)
	{
		LOGE("Failed to start external process %s with execv.\n", options.external_replayer_path);
		exit(errno);
	}
	else
	{
		LOGE("Failed to start external process %s with execv.\n", options.external_replayer_path);
		exit(1);
	}
}